

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O3

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::CreateInputStream2
          (DefaultShaderSourceStreamFactory *this,Char *Name,
          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,IFileStream **ppStream)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  pointer pbVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> FullPath;
  long *local_68 [2];
  long local_58 [2];
  Char *local_48;
  long *local_40;
  Char *local_38;
  
  local_38 = Name;
  bVar3 = BasicFileSystem::IsPathAbsolute(Name);
  if (bVar3) {
    CreateInputStream2::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)local_68,Name);
    plVar5 = local_68[0];
    if (local_68[0] != (long *)0x0) {
LAB_0025d150:
      (**(code **)*plVar5)(plVar5,IID_FileStream,ppStream);
      (**(code **)(*plVar5 + 0x10))(plVar5);
      return;
    }
  }
  else {
    pbVar4 = (this->m_SearchDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->m_SearchDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar4 != pbVar1) {
      local_48 = Name + 1;
      do {
        pcVar2 = (pbVar4->_M_dataplus)._M_p;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,pcVar2,pcVar2 + pbVar4->_M_string_length);
        std::__cxx11::string::append((char *)local_68);
        CreateInputStream2::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&local_40,(char *)local_68[0]);
        plVar5 = local_40;
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
        if (plVar5 != (long *)0x0) goto LAB_0025d150;
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != pbVar1);
    }
  }
  *ppStream = (IFileStream *)0x0;
  if ((Flags & CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT) ==
      CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_NONE) {
    LogError<false,char[47],char_const*>
              (false,"CreateInputStream2",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DefaultShaderSourceStreamFactory.cpp"
               ,0x76,(char (*) [47])"Failed to create input stream for source file ",&local_38);
  }
  return;
}

Assistant:

void DefaultShaderSourceStreamFactory::CreateInputStream2(const Char*                             Name,
                                                          CREATE_SHADER_SOURCE_INPUT_STREAM_FLAGS Flags,
                                                          IFileStream**                           ppStream)
{
    auto CreateFileStream = [](const char* Path) //
    {
        RefCntAutoPtr<BasicFileStream> pFileStream;
        if (FileSystem::FileExists(Path))
        {
            pFileStream = BasicFileStream::Create(Path, EFileAccessMode::Read);
            if (!pFileStream->IsValid())
                pFileStream.Release();
        }
        return pFileStream;
    };

    RefCntAutoPtr<BasicFileStream> pFileStream;
    if (FileSystem::IsPathAbsolute(Name))
    {
        pFileStream = CreateFileStream(Name);
    }
    else
    {
        for (const auto& SearchDir : m_SearchDirectories)
        {
            const auto FullPath = SearchDir + ((Name[0] == '\\' || Name[0] == '/') ? Name + 1 : Name);
            pFileStream         = CreateFileStream(FullPath.c_str());
            if (pFileStream)
                break;
        }
    }

    if (pFileStream)
    {
        pFileStream->QueryInterface(IID_FileStream, reinterpret_cast<IObject**>(ppStream));
    }
    else
    {
        *ppStream = nullptr;
        if ((Flags & CREATE_SHADER_SOURCE_INPUT_STREAM_FLAG_SILENT) == 0)
        {
            LOG_ERROR("Failed to create input stream for source file ", Name);
        }
    }
}